

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O0

ngx_int_t ngx_hash_add_key(ngx_hash_keys_arrays_t *ha,ngx_str_t *key,void *value,ngx_uint_t flags)

{
  ngx_array_t *pnVar1;
  byte bVar2;
  int iVar3;
  ngx_uint_t nVar4;
  undefined1 *__n;
  size_t *psVar5;
  void *pvVar6;
  u_char *puVar7;
  ngx_int_t nVar8;
  long *plVar9;
  ulong uVar10;
  ngx_hash_key_t *hk;
  ngx_array_t *hwc;
  ngx_array_t *keys;
  ngx_uint_t last;
  ngx_uint_t skip;
  ngx_uint_t n;
  ngx_uint_t k;
  ngx_uint_t i;
  ngx_str_t *name;
  u_char *p;
  size_t len;
  ngx_uint_t flags_local;
  void *value_local;
  ngx_str_t *key_local;
  ngx_hash_keys_arrays_t *ha_local;
  
  keys = (ngx_array_t *)key->len;
  if ((flags & 1) != 0) {
    skip = 0;
    for (k = 0; k < key->len; k = k + 1) {
      if ((key->data[k] == '*') && (skip = skip + 1, 1 < skip)) {
        return -5;
      }
      if ((key->data[k] == '.') && (key->data[k + 1] == '.')) {
        return -5;
      }
      if (key->data[k] == '\0') {
        return -5;
      }
    }
    if ((1 < key->len) && (*key->data == '.')) {
      last = 1;
      goto LAB_00118012;
    }
    if (2 < key->len) {
      if ((*key->data == '*') && (key->data[1] == '.')) {
        last = 2;
LAB_00118012:
        nVar4 = ngx_hash_strlow(key->data + last,key->data + last,(long)keys - last);
        uVar10 = nVar4 % ha->hsize;
        if (last == 1) {
          pvVar6 = ha->keys_hash[uVar10].elts;
          if (pvVar6 == (void *)0x0) {
            nVar8 = ngx_array_init(ha->keys_hash + uVar10,ha->temp_pool,4,0x10);
            if (nVar8 != 0) {
              return -1;
            }
          }
          else {
            __n = (undefined1 *)((long)&keys[-1].pool + 7);
            for (k = 0; k < ha->keys_hash[uVar10].nelts; k = k + 1) {
              if ((__n == *(undefined1 **)((long)pvVar6 + k * 0x10)) &&
                 (iVar3 = strncmp((char *)(key->data + 1),*(char **)((long)pvVar6 + k * 0x10 + 8),
                                  (size_t)__n), iVar3 == 0)) {
                return -3;
              }
            }
          }
          psVar5 = (size_t *)ngx_array_push(ha->keys_hash + uVar10);
          if (psVar5 == (size_t *)0x0) {
            return -1;
          }
          *psVar5 = (size_t)((long)&keys[-1].pool + 7);
          pvVar6 = ngx_pnalloc(ha->temp_pool,*psVar5);
          psVar5[1] = (size_t)pvVar6;
          if (psVar5[1] == 0) {
            return -1;
          }
          memcpy((void *)psVar5[1],key->data + 1,*psVar5);
        }
        if (last == 0) {
          keys = (ngx_array_t *)((long)&keys->elts + 1);
          name = (ngx_str_t *)ngx_pnalloc(ha->temp_pool,(size_t)keys);
          if (name == (ngx_str_t *)0x0) {
            return -1;
          }
          ngx_cpystrn((u_char *)name,key->data,(size_t)keys);
          hk = (ngx_hash_key_t *)&ha->dns_wc_tail;
          pnVar1 = ha->dns_wc_tail_hash;
        }
        else {
          name = (ngx_str_t *)ngx_pnalloc(ha->temp_pool,(size_t)keys);
          if (name == (ngx_str_t *)0x0) {
            return -1;
          }
          p = (u_char *)0x0;
          skip = 0;
          pnVar1 = keys;
          while (k = (long)&pnVar1[-1].pool + 7, k != 0) {
            if (key->data[k] == '.') {
              memcpy((void *)((long)&name->len + skip),key->data + (long)pnVar1,(size_t)p);
              puVar7 = p + skip;
              skip = (ngx_uint_t)(puVar7 + 1);
              puVar7[(long)&name->len] = '.';
              p = (u_char *)0x0;
              pnVar1 = (ngx_array_t *)k;
            }
            else {
              p = p + 1;
              pnVar1 = (ngx_array_t *)k;
            }
          }
          if (p != (u_char *)0x0) {
            memcpy((void *)((long)&name->len + skip),key->data + 1,(size_t)p);
            skip = (ngx_uint_t)(p + skip);
          }
          *(undefined1 *)((long)&name->len + skip) = 0;
          hk = (ngx_hash_key_t *)&ha->dns_wc_head;
          pnVar1 = ha->dns_wc_head_hash;
        }
        hwc = pnVar1 + uVar10;
        pvVar6 = hwc->elts;
        if (pvVar6 == (void *)0x0) {
          nVar8 = ngx_array_init(hwc,ha->temp_pool,4,0x10);
          if (nVar8 != 0) {
            return -1;
          }
        }
        else {
          for (k = 0; k < hwc->nelts; k = k + 1) {
            if (((long)keys - last == *(size_t *)((long)pvVar6 + k * 0x10)) &&
               (iVar3 = strncmp((char *)(key->data + last),*(char **)((long)pvVar6 + k * 0x10 + 8),
                                (long)keys - last), iVar3 == 0)) {
              return -3;
            }
          }
        }
        psVar5 = (size_t *)ngx_array_push(hwc);
        if (psVar5 == (size_t *)0x0) {
          ha_local = (ngx_hash_keys_arrays_t *)0xffffffffffffffff;
        }
        else {
          *psVar5 = (long)keys - last;
          pvVar6 = ngx_pnalloc(ha->temp_pool,*psVar5);
          psVar5[1] = (size_t)pvVar6;
          if (psVar5[1] == 0) {
            ha_local = (ngx_hash_keys_arrays_t *)0xffffffffffffffff;
          }
          else {
            memcpy((void *)psVar5[1],key->data + last,*psVar5);
            plVar9 = (long *)ngx_array_push((ngx_array_t *)hk);
            if (plVar9 == (long *)0x0) {
              ha_local = (ngx_hash_keys_arrays_t *)0xffffffffffffffff;
            }
            else {
              *plVar9 = (long)((long)&keys[-1].pool + 7);
              plVar9[1] = (long)name;
              plVar9[2] = 0;
              plVar9[3] = (long)value;
              ha_local = (ngx_hash_keys_arrays_t *)0x0;
            }
          }
        }
        return (ngx_int_t)ha_local;
      }
      if ((key->data[k - 2] == '.') && (key->data[k - 1] == '*')) {
        last = 0;
        keys = (ngx_array_t *)((long)&keys[-1].pool + 6);
        goto LAB_00118012;
      }
    }
    if (skip != 0) {
      return -5;
    }
  }
  n = 0;
  for (k = 0; k < keys; k = k + 1) {
    if ((flags & 2) == 0) {
      if ((key->data[k] < 0x41) || (0x5a < key->data[k])) {
        bVar2 = key->data[k];
      }
      else {
        bVar2 = key->data[k] | 0x20;
      }
      key->data[k] = bVar2;
    }
    n = n * 0x1f + (ulong)key->data[k];
  }
  uVar10 = n % ha->hsize;
  pvVar6 = ha->keys_hash[uVar10].elts;
  if (pvVar6 == (void *)0x0) {
    nVar8 = ngx_array_init(ha->keys_hash + uVar10,ha->temp_pool,4,0x10);
    if (nVar8 != 0) {
      return -1;
    }
  }
  else {
    for (k = 0; k < ha->keys_hash[uVar10].nelts; k = k + 1) {
      if ((keys == *(ngx_array_t **)((long)pvVar6 + k * 0x10)) &&
         (iVar3 = strncmp((char *)key->data,*(char **)((long)pvVar6 + k * 0x10 + 8),(size_t)keys),
         iVar3 == 0)) {
        return -3;
      }
    }
  }
  psVar5 = (size_t *)ngx_array_push(ha->keys_hash + uVar10);
  if (psVar5 == (size_t *)0x0) {
    return -1;
  }
  *psVar5 = key->len;
  psVar5[1] = (size_t)key->data;
  psVar5 = (size_t *)ngx_array_push(&ha->keys);
  if (psVar5 == (size_t *)0x0) {
    return -1;
  }
  *psVar5 = key->len;
  psVar5[1] = (size_t)key->data;
  nVar4 = ngx_hash_key(key->data,(size_t)keys);
  psVar5[2] = nVar4;
  psVar5[3] = (size_t)value;
  return 0;
}

Assistant:

ngx_int_t
ngx_hash_add_key(ngx_hash_keys_arrays_t *ha, ngx_str_t *key, void *value,
    ngx_uint_t flags)
{
    size_t           len;
    u_char          *p;
    ngx_str_t       *name;
    ngx_uint_t       i, k, n, skip, last;
    ngx_array_t     *keys, *hwc;
    ngx_hash_key_t  *hk;

    last = key->len;

    if (flags & NGX_HASH_WILDCARD_KEY) {

        /*
         * supported wildcards:
         *     "*.example.com", ".example.com", and "www.example.*"
         */

        n = 0;

        for (i = 0; i < key->len; i++) {

            if (key->data[i] == '*') {
                if (++n > 1) {
                    return NGX_DECLINED;
                }
            }

            if (key->data[i] == '.' && key->data[i + 1] == '.') {
                return NGX_DECLINED;
            }

            if (key->data[i] == '\0') {
                return NGX_DECLINED;
            }
        }

        if (key->len > 1 && key->data[0] == '.') {
            skip = 1;
            goto wildcard;
        }

        if (key->len > 2) {

            if (key->data[0] == '*' && key->data[1] == '.') {
                skip = 2;
                goto wildcard;
            }

            if (key->data[i - 2] == '.' && key->data[i - 1] == '*') {
                skip = 0;
                last -= 2;
                goto wildcard;
            }
        }

        if (n) {
            return NGX_DECLINED;
        }
    }

    /* exact hash */

    k = 0;

    for (i = 0; i < last; i++) {
        if (!(flags & NGX_HASH_READONLY_KEY)) {
            key->data[i] = ngx_tolower(key->data[i]);
        }
        k = ngx_hash(k, key->data[i]);
    }

    k %= ha->hsize;

    /* check conflicts in exact hash */

    name = ha->keys_hash[k].elts;

    if (name) {
        for (i = 0; i < ha->keys_hash[k].nelts; i++) {
            if (last != name[i].len) {
                continue;
            }

            if (ngx_strncmp(key->data, name[i].data, last) == 0) {
                return NGX_BUSY;
            }
        }

    } else {
        if (ngx_array_init(&ha->keys_hash[k], ha->temp_pool, 4,
                           sizeof(ngx_str_t))
            != NGX_OK)
        {
            return NGX_ERROR;
        }
    }

    name = ngx_array_push(&ha->keys_hash[k]);
    if (name == NULL) {
        return NGX_ERROR;
    }

    *name = *key;

    hk = ngx_array_push(&ha->keys);
    if (hk == NULL) {
        return NGX_ERROR;
    }

    hk->key = *key;
    hk->key_hash = ngx_hash_key(key->data, last);
    hk->value = value;

    return NGX_OK;


wildcard:

    /* wildcard hash */

    k = ngx_hash_strlow(&key->data[skip], &key->data[skip], last - skip);

    k %= ha->hsize;

    if (skip == 1) {

        /* check conflicts in exact hash for ".example.com" */

        name = ha->keys_hash[k].elts;

        if (name) {
            len = last - skip;

            for (i = 0; i < ha->keys_hash[k].nelts; i++) {
                if (len != name[i].len) {
                    continue;
                }

                if (ngx_strncmp(&key->data[1], name[i].data, len) == 0) {
                    return NGX_BUSY;
                }
            }

        } else {
            if (ngx_array_init(&ha->keys_hash[k], ha->temp_pool, 4,
                               sizeof(ngx_str_t))
                != NGX_OK)
            {
                return NGX_ERROR;
            }
        }

        name = ngx_array_push(&ha->keys_hash[k]);
        if (name == NULL) {
            return NGX_ERROR;
        }

        name->len = last - 1;
        name->data = ngx_pnalloc(ha->temp_pool, name->len);
        if (name->data == NULL) {
            return NGX_ERROR;
        }

        ngx_memcpy(name->data, &key->data[1], name->len);
    }


    if (skip) {

        /*
         * convert "*.example.com" to "com.example.\0"
         *      and ".example.com" to "com.example\0"
         */

        p = ngx_pnalloc(ha->temp_pool, last);
        if (p == NULL) {
            return NGX_ERROR;
        }

        len = 0;
        n = 0;

        for (i = last - 1; i; i--) {
            if (key->data[i] == '.') {
                ngx_memcpy(&p[n], &key->data[i + 1], len);
                n += len;
                p[n++] = '.';
                len = 0;
                continue;
            }

            len++;
        }

        if (len) {
            ngx_memcpy(&p[n], &key->data[1], len);
            n += len;
        }

        p[n] = '\0';

        hwc = &ha->dns_wc_head;
        keys = &ha->dns_wc_head_hash[k];

    } else {

        /* convert "www.example.*" to "www.example\0" */

        last++;

        p = ngx_pnalloc(ha->temp_pool, last);
        if (p == NULL) {
            return NGX_ERROR;
        }

        ngx_cpystrn(p, key->data, last);

        hwc = &ha->dns_wc_tail;
        keys = &ha->dns_wc_tail_hash[k];
    }


    /* check conflicts in wildcard hash */

    name = keys->elts;

    if (name) {
        len = last - skip;

        for (i = 0; i < keys->nelts; i++) {
            if (len != name[i].len) {
                continue;
            }

            if (ngx_strncmp(key->data + skip, name[i].data, len) == 0) {
                return NGX_BUSY;
            }
        }

    } else {
        if (ngx_array_init(keys, ha->temp_pool, 4, sizeof(ngx_str_t)) != NGX_OK)
        {
            return NGX_ERROR;
        }
    }

    name = ngx_array_push(keys);
    if (name == NULL) {
        return NGX_ERROR;
    }

    name->len = last - skip;
    name->data = ngx_pnalloc(ha->temp_pool, name->len);
    if (name->data == NULL) {
        return NGX_ERROR;
    }

    ngx_memcpy(name->data, key->data + skip, name->len);


    /* add to wildcard hash */

    hk = ngx_array_push(hwc);
    if (hk == NULL) {
        return NGX_ERROR;
    }

    hk->key.len = last - 1;
    hk->key.data = p;
    hk->key_hash = 0;
    hk->value = value;

    return NGX_OK;
}